

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O3

string * getCPUModel_abi_cxx11_(void)

{
  _Alloc_hider _Var1;
  char cVar2;
  istream *piVar3;
  size_type sVar4;
  size_type sVar5;
  void *pvVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string info;
  string line;
  ifstream cpufile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,"/proc/cpuinfo",_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) goto LAB_00388f7f;
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&local_258,"model name",0,10);
    } while (sVar4 == 0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_278,local_258._M_dataplus._M_p,local_258._M_string_length);
LAB_00388f7f:
    std::ifstream::close();
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_278,"model name",0,10);
    sVar4 = local_278._M_string_length;
    _Var1._M_p = local_278._M_dataplus._M_p;
    if (sVar5 == 0xffffffffffffffff) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      in_RDI->_M_string_length = 0;
      (in_RDI->field_2)._M_local_buf[0] = '\0';
    }
    else {
      if (local_278._M_string_length < sVar5 || local_278._M_string_length - sVar5 == 0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        pvVar6 = memchr(local_278._M_dataplus._M_p + sVar5,0x3a,local_278._M_string_length - sVar5);
        uVar7 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var1._M_p;
        do {
          cVar2 = _Var1._M_p[sVar5];
          if ((cVar2 == '\n') || (cVar2 == '\r')) goto LAB_00389017;
          sVar5 = sVar5 + 1;
        } while (sVar4 != sVar5);
      }
      sVar5 = 0xffffffffffffffff;
LAB_00389017:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_RDI,&local_278,uVar7 + 1,~uVar7 + sVar5);
      if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] == '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (in_RDI);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  std::ifstream::~ifstream(local_238);
  return in_RDI;
}

Assistant:

inline std::string getCPUModel()
{  // Get the cpu from /proc/cpuinfo
    std::ifstream cpufile("/proc/cpuinfo");
    if (!cpufile) {
        return std::string{};
    }
    std::string info;
    std::string line;
    while (getline(cpufile, line)) {
        if (line.find("model name") != std::string::npos) {
            info.append(line);
            break;
        }
    }
    cpufile.close();
    auto modelLoc = info.find("model name");

    if (modelLoc != std::string::npos) {
        auto cloc = info.find_first_of(':', modelLoc);
        auto eline = info.find_first_of("\n\r\0", modelLoc);
        auto modelString = info.substr(cloc + 1, eline - cloc - 1);
        if (modelString.back() == '\0') {
            modelString.pop_back();
        }
        return modelString;
    }
    return std::string{};
}